

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O3

void __thiscall sophia_interface::LUEDIT(sophia_interface *this,int MEDIT)

{
  double dVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int (*paiVar6) [4000];
  uint uVar7;
  int iVar8;
  int *piVar9;
  double (*padVar10) [4000];
  int iVar11;
  uint uVar12;
  sophia_interface *psVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  double (*padVar22) [4000];
  uint uVar23;
  ulong uVar24;
  long lVar25;
  double *pdVar26;
  long lVar27;
  int iVar28;
  bool bVar29;
  double dVar30;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  double dStack_88;
  double PTS [2];
  double PLS [2];
  int NS [2];
  
  if (((uint)MEDIT < 4) || (MEDIT == 5)) {
    uVar3 = this->N;
    psVar13 = (sophia_interface *)(ulong)(uint)MSTU[0];
    uVar5 = MSTU[1];
    if (MSTU[1] < 1) {
      uVar5 = uVar3;
    }
    uVar7 = 1;
    if (1 < MSTU[0]) {
      uVar7 = MSTU[0];
    }
    uVar19 = uVar7 - 1;
    uVar21 = (ulong)uVar19;
    if ((int)uVar7 <= (int)uVar5) {
      uVar4 = (ulong)uVar7;
      uVar24 = uVar4 - 1;
      lVar27 = (long)(this->K + -1) + 0x3e7c + uVar4 * 4;
      pdVar26 = this->V[-1] + uVar4 + 3999;
      NS = (int  [2])this->P;
      do {
        iVar28 = this->K[0][uVar24];
        if (iVar28 < 0x15 && iVar28 != 0) {
          switch(MEDIT) {
          case 1:
            if (iVar28 < 0xb) goto switchD_0010d4dc_caseD_4;
            break;
          case 2:
            if (iVar28 < 0xb) {
              uVar3 = LUCOMP(psVar13,this->K[1][uVar24]);
              uVar3 = uVar3 >> 1 | (uint)((uVar3 & 1) != 0) << 0x1f;
              if ((3 < uVar3 - 6) && (uVar3 != 0)) goto switchD_0010d4dc_caseD_4;
            }
            break;
          case 3:
            if (iVar28 < 0xb) {
              iVar28 = this->K[1][uVar24];
              iVar18 = LUCOMP(psVar13,iVar28);
              if (iVar18 != 0) {
                if (KCHG[0][(long)iVar18 + 499] == 0) {
                  iVar28 = LUCHGE(psVar13,iVar28);
                  goto joined_r0x0010d5d7;
                }
                goto switchD_0010d4dc_caseD_4;
              }
            }
            break;
          default:
switchD_0010d4dc_caseD_4:
            lVar25 = (long)NS + uVar21 * 8;
            lVar15 = 0;
            do {
              psVar13 = (sophia_interface *)(ulong)*(uint *)(lVar27 + lVar15);
              *(uint *)((long)this->K[0] + lVar15 + uVar21 * 4) = *(uint *)(lVar27 + lVar15);
              *(undefined8 *)(lVar25 + lVar15 * 2) =
                   *(undefined8 *)((long)pdVar26 + lVar15 * 2 + -160000);
              *(undefined8 *)(lVar25 + 160000 + lVar15 * 2) =
                   *(undefined8 *)((long)pdVar26 + lVar15 * 2);
              lVar15 = lVar15 + 16000;
            } while (lVar15 != 80000);
            this->K[2][uVar21] = 0;
            uVar21 = (ulong)((int)uVar21 + 1);
            break;
          case 5:
            if ((1 < iVar28 - 0xdU) && (iVar18 = LUCOMP(psVar13,this->K[1][uVar24]), iVar18 != 0)) {
              if (10 < iVar28) {
                iVar28 = KCHG[0][(long)iVar18 + 499];
joined_r0x0010d5d7:
                if (iVar28 == 0) break;
              }
              goto switchD_0010d4dc_caseD_4;
            }
          }
        }
        uVar19 = (uint)uVar21;
        uVar24 = uVar24 + 1;
        lVar27 = lVar27 + 4;
        pdVar26 = pdVar26 + 1;
      } while (uVar24 != uVar5);
      uVar3 = this->N;
    }
    if ((int)uVar19 < (int)uVar3) {
      MSTU[2] = 0;
      uVar3 = this->N;
    }
    if ((int)uVar19 < (int)uVar3) {
      MSTU[0x45] = 0;
    }
    this->N = uVar19;
  }
  else if (MEDIT - 0xbU < 5) {
    iVar28 = this->N;
    if (0 < (long)iVar28) {
      lVar27 = 0;
      iVar18 = 0;
      do {
        iVar8 = this->K[2][lVar27] % MSTU[4];
        this->K[2][lVar27] = iVar8;
        switch(MEDIT - 0xbU) {
        case 0:
          if (-1 < this->K[0][lVar27]) break;
          goto LAB_0010d76b;
        case 1:
          if (this->K[0][lVar27] == 0) goto LAB_0010d76b;
          break;
        case 2:
          uVar3 = this->K[0][lVar27];
          if ((uVar3 < 0x10) &&
             (((0x9800U >> (uVar3 & 0x1f) & 1) != 0 && (this->K[1][lVar27] != 0x5e))))
          goto LAB_0010d76b;
          break;
        case 3:
          if ((this->K[0][lVar27] - 0xdU < 2) || (this->K[1][lVar27] == 0x5e)) goto LAB_0010d76b;
          break;
        case 4:
          if (0x14 < this->K[0][lVar27]) goto LAB_0010d76b;
        }
        iVar18 = iVar18 + 1;
        this->K[2][lVar27] = MSTU[4] * iVar18 + iVar8;
LAB_0010d76b:
        lVar27 = lVar27 + 1;
      } while (iVar28 != lVar27);
      uVar21 = 1;
      do {
        uVar3 = *(uint *)((long)(this->K + -1) + 0x3e7c + uVar21 * 4);
        if (0xffffffeb < uVar3 - 0x15) {
          iVar18 = this->K[1][uVar21 + 3999];
          if (iVar18 / MSTU[4] != 0) {
            uVar24 = uVar21 & 0xffffffff;
            do {
              while( true ) {
                uVar24 = (long)this->K[1][(long)(int)uVar24 + 3999] % (long)MSTU[4];
                iVar8 = (int)uVar24;
                uVar24 = uVar24 & 0xffffffff;
                if (iVar28 < iVar8 || (iVar8 < 1 || MEDIT != 0xd)) break;
                uVar5 = this->K[0][iVar8 - 1U];
                if ((0xf < uVar5) ||
                   (((0x9800U >> (uVar5 & 0x1f) & 1) == 0 || (this->K[1][iVar8 - 1U] == 0x5e))))
                goto LAB_0010d82f;
              }
              if (((MEDIT != 0xe) || (iVar8 < 1)) || (iVar28 < iVar8)) {
                iVar18 = iVar18 - iVar18 % MSTU[4];
                this->K[1][uVar21 + 3999] = iVar18;
                if (iVar8 != 0) goto LAB_0010d84f;
                goto LAB_0010d869;
              }
            } while ((this->K[0][iVar8 - 1U] - 0xdU < 2) || (this->K[1][iVar8 - 1U] == 0x5e));
LAB_0010d82f:
            iVar18 = iVar18 - iVar18 % MSTU[4];
            this->K[1][uVar21 + 3999] = iVar18;
LAB_0010d84f:
            this->K[1][uVar21 + 3999] = this->K[1][(long)iVar8 + 3999] / MSTU[4] + iVar18;
LAB_0010d869:
            if ((uVar3 < 0xf) && ((0x6008U >> (uVar3 & 0x1f) & 1) != 0)) {
              iVar18 = this->K[2][uVar21 + 3999];
              iVar11 = iVar18 % MSTU[4];
              iVar8 = (int)((long)((ulong)(uint)((int)((long)iVar18 / (long)MSTU[4]) >> 0x1f) <<
                                   0x20 | (long)iVar18 / (long)MSTU[4] & 0xffffffffU) %
                           (long)MSTU[4]);
              if (iVar8 <= MSTU[3] && 0 < iVar8) {
                iVar8 = this->K[2][iVar8 - 1] / MSTU[4];
              }
              if (iVar11 <= MSTU[3] && 0 < iVar11) {
                iVar11 = this->K[2][iVar11 - 1] / MSTU[4];
              }
              this->K[2][uVar21 + 3999] =
                   (iVar18 + iVar11 + iVar8 * MSTU[4]) - iVar18 % (MSTU[4] * MSTU[4]);
              iVar18 = this->K[3][uVar21 + 3999];
              iVar11 = iVar18 % MSTU[4];
              iVar8 = (int)((long)((ulong)(uint)((int)((long)iVar18 / (long)MSTU[4]) >> 0x1f) <<
                                   0x20 | (long)iVar18 / (long)MSTU[4] & 0xffffffffU) %
                           (long)MSTU[4]);
              if (iVar8 <= MSTU[3] && 0 < iVar8) {
                iVar8 = this->K[2][iVar8 - 1] / MSTU[4];
              }
              if (iVar11 <= MSTU[3] && 0 < iVar11) {
                iVar11 = this->K[2][iVar11 - 1] / MSTU[4];
              }
              this->K[3][uVar21 + 3999] =
                   (iVar18 + iVar11 + iVar8 * MSTU[4]) - iVar18 % (MSTU[4] * MSTU[4]);
            }
            else {
              iVar18 = this->K[2][uVar21 + 3999];
              if (iVar18 <= MSTU[3] && 0 < iVar18) {
                this->K[2][uVar21 + 3999] = this->K[2][iVar18 - 1] / MSTU[4];
              }
              iVar18 = this->K[3][uVar21 + 3999];
              if ((0 < iVar18) && (iVar18 <= MSTU[3])) {
                this->K[3][uVar21 + 3999] = this->K[2][iVar18 - 1] / MSTU[4];
              }
            }
          }
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != iVar28 + 1);
    }
    iVar18 = MSTU[0x59];
    uVar21 = (ulong)(uint)MSTU[0x59];
    MSTU[0x59] = 0;
    iVar28 = this->N;
    if (iVar28 < 1) {
      iVar8 = 0;
    }
    else {
      padVar10 = this->P;
      lVar27 = 0;
      iVar8 = 0;
      padVar22 = padVar10;
      paiVar6 = this->K;
      do {
        if (this->K[2][lVar27] / MSTU[4] != 0) {
          lVar25 = (long)iVar8;
          lVar15 = 0;
          do {
            *(undefined4 *)((long)this->K[0] + lVar15 + lVar25 * 4) =
                 *(undefined4 *)((long)*paiVar6 + lVar15);
            *(undefined8 *)((long)*padVar10 + lVar15 * 2 + lVar25 * 8) =
                 *(undefined8 *)((long)*padVar22 + lVar15 * 2);
            *(undefined8 *)((long)padVar10[5] + lVar15 * 2 + lVar25 * 8) =
                 *(undefined8 *)((long)padVar22[5] + lVar15 * 2);
            lVar15 = lVar15 + 16000;
          } while (lVar15 != 80000);
          iVar8 = iVar8 + 1;
          this->K[2][lVar25] = this->K[2][lVar25] % MSTU[4];
          if (0 < iVar18) {
            uVar24 = 0;
            do {
              if (lVar27 + 1U == (ulong)(uint)MSTU[uVar24 + 0x5a]) {
                lVar25 = (long)MSTU[0x59];
                MSTU[0x59] = MSTU[0x59] + 1;
                MSTU[lVar25 + 0x5a] = iVar8;
                PARU[(long)MSTU[0x59] + 0x59] = PARU[uVar24 + 0x5a];
              }
              uVar24 = uVar24 + 1;
            } while (uVar21 != uVar24);
          }
        }
        lVar27 = lVar27 + 1;
        iVar28 = this->N;
        paiVar6 = (int (*) [4000])(*paiVar6 + 1);
        padVar22 = (double (*) [4000])(*padVar22 + 1);
      } while (lVar27 < iVar28);
    }
    if (iVar8 < iVar28) {
      MSTU[2] = 0;
      iVar28 = this->N;
    }
    if (iVar8 < iVar28) {
      MSTU[0x45] = 0;
    }
    this->N = iVar8;
  }
  else {
    switch(MEDIT) {
    case 0x10:
      iVar28 = this->N;
      if (0 < iVar28) {
        uVar3 = 1;
        do {
          lVar27 = (long)(int)uVar3;
          uVar5 = uVar3;
          if (((0xfffffff5 < *(int *)((long)(this->K + -1) + 0x3e7c + lVar27 * 4) - 0x15U) &&
              (lVar25 = lVar27 + -1, this->K[2][lVar27 + 3999] == 0)) &&
             (this->K[3][lVar27 + 3999] == 0)) {
            piVar14 = this->K[2] + lVar27 + 3999;
            piVar9 = this->K[3] + lVar27 + 3999;
            uVar7 = 0;
            if ((int)uVar3 < iVar28) {
              lVar15 = (long)(int)uVar3;
              uVar23 = 0;
              uVar7 = 0;
              uVar19 = uVar3;
              do {
                uVar19 = uVar19 + 1;
                if (this->K[2][lVar15] == uVar3) {
                  uVar12 = uVar19;
                  piVar2 = piVar14;
                  if (uVar7 != 0) {
                    uVar12 = uVar7;
                    piVar2 = piVar9;
                    uVar23 = uVar19;
                  }
                  uVar7 = uVar12;
                  *piVar2 = uVar19;
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 < this->N);
              if (uVar23 == 0) goto LAB_0010dab2;
            }
            else {
LAB_0010dab2:
              *piVar9 = uVar7;
              uVar23 = uVar7;
            }
            if ((((uVar7 == 0) && (uVar7 = this->K[1][lVar27 + 3999], 0 < (int)uVar7)) &&
                (((int)uVar7 < (int)uVar3 &&
                 ((uVar19 = uVar7 - 1, 0xfffffff5 < this->K[0][uVar19] - 0x1fU &&
                  (this->K[1][uVar19] == this->K[0][lVar27 + 3999])))))) &&
               (ABS(this->P[4][uVar19] - this->P[3][lVar27 + 3999]) <= 0.01)) {
              uVar19 = 0;
              if ((int)uVar3 < this->N) {
                uVar19 = 0;
                uVar20 = 0;
                lVar15 = lVar27;
                uVar12 = uVar3 + 1;
                do {
                  if (this->K[2][lVar15] == uVar7) {
                    bVar29 = uVar19 != 0;
                    uVar19 = uVar12;
                    piVar2 = piVar14;
                    if (bVar29) {
                      uVar19 = uVar20;
                      piVar2 = piVar9;
                      uVar23 = uVar12;
                    }
                    *piVar2 = uVar12;
                    uVar20 = uVar19;
                  }
                  lVar15 = lVar15 + 1;
                  uVar12 = uVar12 + 1;
                } while (lVar15 < this->N);
              }
              if (uVar23 == 0) {
                *piVar9 = uVar19;
              }
              if (uVar19 == 0) {
                iVar28 = uVar7 + 1;
                uVar19 = uVar7;
                uVar23 = uVar7;
                uVar12 = uVar7;
                while (iVar28 < (int)uVar3) {
                  if (((this->K[2][uVar19] == uVar7) && (this->K[0][uVar19] - 0x15U < 10)) &&
                     (uVar23 = uVar19 + 1, uVar12 == uVar7)) {
                    uVar12 = uVar23;
                  }
                  iVar28 = uVar19 + 2;
                  uVar19 = uVar19 + 1;
                }
                if ((int)uVar3 < this->N) {
                  piVar14 = this->K[2] + lVar27 + 3999;
                  lVar25 = (lVar27 << 0x20) + -0x100000000;
                  do {
                    uVar7 = this->K[2][uVar3];
                    if ((uVar7 == uVar12) || (uVar7 == uVar23)) {
                      piVar9 = piVar14 + 4000;
                      if (*piVar14 == 0) {
                        piVar9 = piVar14;
                      }
                      *piVar9 = uVar3 + 1;
                    }
                    lVar25 = lVar25 + 0x100000000;
                    piVar14 = piVar14 + 1;
                    uVar5 = uVar5 + 1;
                  } while ((int)uVar3 < this->N);
                  lVar25 = lVar25 >> 0x20;
                }
                if (this->K[4][lVar25] == 0) {
                  this->K[4][lVar25] = this->K[3][lVar25];
                }
              }
            }
          }
          uVar3 = uVar5 + 1;
          iVar28 = this->N;
        } while ((int)uVar5 < iVar28);
      }
      break;
    default:
      if (MEDIT - 0x1fU < 2) {
        iVar28 = MSTU[2] + this->N;
        dVar30 = ULANGL(this,*(double *)((long)(this->P + -1) + ((long)MSTU[0x3c] * 2 + 0x1f3e) * 4)
                        ,this->P[0][(long)MSTU[0x3c] + 3999]);
        psVar13 = this;
        LUDBRB(this,1,iVar28,0.0,-dVar30,0.0,0.0,0.0,false);
        iVar28 = MSTU[2] + this->N;
        dVar30 = ULANGL(psVar13,this->P[1][(long)MSTU[0x3c] + 3999],
                        *(double *)((long)(this->P + -1) + ((long)MSTU[0x3c] * 2 + 0x1f3e) * 4));
        psVar13 = this;
        LUDBRB(this,1,iVar28,-dVar30,0.0,0.0,0.0,0.0,false);
        iVar28 = MSTU[2] + this->N;
        dVar30 = this->P[0][MSTU[0x3c]];
        dVar30 = ULANGL(psVar13,dVar30,dVar30);
        psVar13 = this;
        LUDBRB(this,1,iVar28,0.0,-dVar30,0.0,0.0,0.0,false);
        if (MEDIT != 0x1f) {
          dStack_88 = 0.0;
          PTS[0] = 0.0;
          PTS[1] = 0.0;
          iVar28 = this->N;
          if (0 < iVar28) {
            lVar27 = 0;
            do {
              iVar28 = MSTU[0x28];
              if (0xfffffff5 < this->K[0][lVar27] - 0xbU) {
                if (1 < MSTU[0x28]) {
                  iVar18 = this->K[1][lVar27];
                  uVar3 = LUCOMP(psVar13,iVar18);
                  uVar5 = uVar3 >> 1 | (uint)((uVar3 & 1) != 0) << 0x1f;
                  if (((uVar5 - 6 < 4) || (uVar5 == 0)) ||
                     ((iVar28 != 2 &&
                      ((KCHG[0][(long)(int)uVar3 + 499] == 0 &&
                       (iVar28 = LUCHGE(psVar13,iVar18), iVar28 == 0)))))) goto LAB_0010e10f;
                }
                pdVar26 = this->P[2] + lVar27;
                uVar21 = (ulong)(*pdVar26 <= 0.0 && *pdVar26 != 0.0);
                NS[uVar21 - 2] = NS[uVar21 - 2] + 1;
                dVar30 = this->P[0][lVar27];
                dVar1 = this->P[1][lVar27];
                PTS[uVar21 - 1] = SQRT(dVar30 * dVar30 + dVar1 * dVar1) + PTS[uVar21 - 1];
              }
LAB_0010e10f:
              lVar27 = lVar27 + 1;
              iVar28 = this->N;
            } while (lVar27 < iVar28);
          }
          if (PTS[0] * 0.0 * PTS[0] < dStack_88 * 0.0 * dStack_88) {
            psVar13 = this;
            LUDBRB(this,1,iVar28 + MSTU[2],PARU[0],0.0,0.0,0.0,0.0,false);
            iVar28 = this->N;
          }
          if (0 < iVar28) {
            lVar27 = 0;
            do {
              iVar28 = MSTU[0x28];
              dVar30 = this->P[2][lVar27];
              if ((dVar30 < 0.0) && (0xfffffff5 < this->K[0][lVar27] - 0xbU)) {
                if (1 < MSTU[0x28]) {
                  iVar18 = this->K[1][lVar27];
                  uVar3 = LUCOMP(psVar13,iVar18);
                  uVar5 = uVar3 >> 1 | (uint)((uVar3 & 1) != 0) << 0x1f;
                  if ((uVar5 - 6 < 4) || (uVar5 == 0)) goto LAB_0010e240;
                  if ((iVar28 != 2) && (KCHG[0][(long)(int)uVar3 + 499] == 0)) {
                    iVar28 = LUCHGE(psVar13,iVar18);
                    if (iVar28 == 0) goto LAB_0010e240;
                    dVar30 = this->P[2][lVar27];
                  }
                }
                pdVar26 = this->P[0] + lVar27;
                uVar21 = (ulong)(*pdVar26 <= 0.0 && *pdVar26 != 0.0);
                PTS[uVar21 + 1] = PTS[uVar21 + 1] - dVar30;
              }
LAB_0010e240:
              lVar27 = lVar27 + 1;
            } while (lVar27 < this->N);
            if (PTS[1] < 0.0) {
              LUDBRB(this,1,this->N + MSTU[2],0.0,PARU[0],0.0,0.0,0.0,false);
              return;
            }
          }
        }
      }
      break;
    case 0x15:
      iVar28 = this->N;
      uVar21 = (ulong)(uint)MSTU[3];
      if (iVar28 * 2 < MSTU[3]) {
        MSTU[0x1f] = iVar28;
        if (0 < iVar28) {
          lVar27 = 0x1d4c4;
          lVar25 = 0;
          lVar15 = 0;
          do {
            lVar16 = 0x9c44;
            lVar17 = lVar27;
            do {
              *(undefined4 *)((long)this + lVar16 + -40000 + ((int)uVar21 + lVar25) * 4) =
                   *(undefined4 *)((long)this + lVar17 + -120000);
              uVar21 = (ulong)MSTU[3];
              *(undefined8 *)((long)(this->K + -1) + 0x3e7c + lVar16 * 2 + (uVar21 + lVar25) * 8) =
                   *(undefined8 *)((long)this + lVar17 * 2 + -160000);
              *(undefined8 *)((long)this->P[2] + lVar16 * 2 + (uVar21 + lVar25) * 8 + 0x3e78) =
                   *(undefined8 *)((long)(this->K + -1) + 0x3e7c + lVar17 * 2);
              lVar17 = lVar17 + 16000;
              lVar16 = lVar16 + 16000;
            } while (lVar16 != 0x1d4c4);
            lVar15 = lVar15 + 1;
            MSTU[0x1f] = this->N;
            lVar27 = lVar27 + 4;
            lVar25 = lVar25 + -1;
          } while (lVar15 < MSTU[0x1f]);
        }
      }
      else {
        psVar13 = (sophia_interface *)local_a8;
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a8,"(LUEDIT:) no more memory left in LUJETS","");
        LUERRM(psVar13,0xb,(string *)local_a8);
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0]);
        }
      }
      break;
    case 0x16:
      if (0 < MSTU[0x1f]) {
        paiVar6 = this->K;
        padVar10 = this->P;
        uVar21 = (ulong)(uint)MSTU[3];
        lVar27 = 0;
        lVar25 = 0;
        do {
          lVar15 = 0;
          do {
            *(undefined4 *)((long)*paiVar6 + lVar15) =
                 *(undefined4 *)((long)this->K[0] + lVar15 + ((int)uVar21 + lVar27) * 4);
            uVar21 = (ulong)MSTU[3];
            *(undefined8 *)((long)*padVar10 + lVar15 * 2) =
                 *(undefined8 *)((long)this->P[0] + lVar15 * 2 + (uVar21 + lVar27) * 8);
            *(undefined8 *)((long)padVar10[5] + lVar15 * 2) =
                 *(undefined8 *)((long)this->V[0] + lVar15 * 2 + (uVar21 + lVar27) * 8);
            lVar15 = lVar15 + 16000;
          } while (lVar15 != 80000);
          lVar25 = lVar25 + 1;
          lVar27 = lVar27 + -1;
          paiVar6 = (int (*) [4000])(*paiVar6 + 1);
          padVar10 = (double (*) [4000])(*padVar10 + 1);
        } while (lVar25 < MSTU[0x1f]);
      }
      this->N = MSTU[0x1f];
      break;
    case 0x17:
      uVar3 = this->N;
      uVar24 = 0;
      uVar21 = uVar24;
      if (0 < (int)uVar3) {
        do {
          iVar28 = this->K[2][uVar24];
          uVar21 = uVar24;
          if (iVar28 < 1) {
            if (iVar28 != 0) break;
          }
          else if (this->K[0][iVar28 - 1] < 0x15) break;
          iVar28 = this->K[0][uVar24];
          if (iVar28 - 0xbU < 10) {
            this->K[0][uVar24] = iVar28 + -10;
          }
          uVar24 = uVar24 + 1;
          uVar21 = (ulong)uVar3;
        } while (uVar3 != uVar24);
      }
      this->N = (int)uVar21;
    }
  }
  return;
}

Assistant:

void sophia_interface::LUEDIT(int MEDIT) {
// Purpose: to perform global manipulations on the event record,
// in particular to exclude unstable or undetectable partons/particles.
    int NS[2];
    double PTS[2];
    double PLS[2];

    // Remove unwanted partons/particles.
    if ((MEDIT >= 0 && MEDIT <= 3) || MEDIT == 5) {
        int IMAX = N;
        if (MSTU[1] > 0) IMAX = MSTU[1];
        int I1 = std::max(1, MSTU[0]) - 1;
        for (int I = std::max(1, MSTU[0]) - 1; I < IMAX; ++I) {
            if (K[0][I] == 0 || K[0][I] > 20) continue;
            if (MEDIT == 1) {
                if (K[0][I] > 10) continue;
            } else if (MEDIT == 2) {
                if (K[0][I] > 10) continue;
                int KC = LUCOMP(K[1][I]);
                if (KC == 0 || KC == 12 || KC == 14 || KC == 16 || KC == 18) continue;
            } else if (MEDIT == 3) {
                if (K[0][I] > 10) continue;
                int KC = LUCOMP(K[1][I]);
                if (KC == 0) continue;
                if (KCHG[1][KC - 1] == 0 && LUCHGE(K[1][I]) == 0) continue;
            } else if (MEDIT == 5) {
                if (K[0][I] == 13 || K[0][I] == 14) continue;
                int KC = LUCOMP(K[1][I]);
                if (KC == 0) continue;
                if (K[0][I] >= 11 && KCHG[1][KC - 1] == 0) continue;
            }

            // Pack remaining partons/particles. Origin no longer known.
            I1++;
            for (int J = 0; J < 5; ++J) {
                K[J][I1 - 1] = K[J][I];
                P[J][I1 - 1] = P[J][I];
                V[J][I1 - 1] = V[J][I];
            }
            K[2][I1 - 1] = 0;
        } 
        if (I1 < N) MSTU[2] = 0;
        if (I1 < N) MSTU[69] = 0;
        N = I1;
 
        // Selective removal of class of entries. New position of retained. 
        } else if (MEDIT >= 11 && MEDIT <= 15) {
            int I1 = 0;
            for (int I = 0; I < N; ++I) {
                K[2][I] = K[2][I] % MSTU[4];
                if (MEDIT == 11 && K[0][I] < 0) continue;
                if (MEDIT == 12 && K[0][I] == 0) continue;
                if (MEDIT == 13 && (K[0][I] == 11 || K[0][I] == 12 || K[0][I] == 15) && K[1][I] != 94) continue;
                if (MEDIT == 14 && (K[0][I] == 13 || K[0][I] == 14 || K[1][I] == 94)) continue;
                if (MEDIT == 15 && K[0][I] >= 21) continue;
                I1++;
                K[2][I] = K[2][I] + MSTU[4] * I1;
            }

            // Find new event history information and replace old.
            for (int I = 1; I < N + 1; ++I) { 
                if (K[0][I - 1] <= 0 || K[0][I - 1] > 20 || K[2][I - 1] / MSTU[4] == 0) continue;
                int ID = I;
                int IM = 0;
                bool repeat130 = false;
                do {
                    repeat130 = false;
                    IM = K[2][ID - 1] % MSTU[4];
                    if (MEDIT == 13 && IM > 0 && IM <= N) {
                        if ((K[0][IM - 1] == 11 || K[0][IM - 1] == 12 || K[0][IM - 1] == 15) && K[1][IM - 1] != 94) {
                            ID = IM;
                            repeat130 = true;
                            continue;
                        }
                    } else if (MEDIT == 14 && IM > 0 && IM <= N) {
                        if (K[0][IM - 1] == 13 || K[0][IM - 1] == 14 || K[1][IM - 1] == 94) {
                            ID = IM;
                            repeat130 = true;
                            continue;
                        }
                    }
                } while (repeat130);

                K[2][I - 1] = MSTU[4] * (K[2][I - 1] / MSTU[4]);
                if (IM != 0) K[2][I - 1] += K[2][IM - 1] / MSTU[4];
                if (K[0][I - 1] != 3 && K[0][I - 1] != 13 && K[0][I - 1] != 14) {
                    if (K[3][I - 1] > 0 && K[3][I - 1] <= MSTU[3]) K[3][I - 1] = K[2][K[3][I - 1] - 1] / MSTU[4];
                    if (K[4][I - 1] > 0 && K[4][I - 1] <= MSTU[3]) K[4][I - 1] = K[2][K[4][I - 1] - 1] / MSTU[4];
                } else {
                    int KCM = (K[3][I - 1] / MSTU[4]) % MSTU[4];
                    if (KCM > 0 && KCM <= MSTU[3]) KCM = K[2][KCM - 1] / MSTU[4];
                    int KCD = K[3][I - 1] % MSTU[4];
                    if (KCD > 0 && KCD <= MSTU[3]) KCD = K[2][KCD - 1] / MSTU[4];
                    K[3][I - 1] = MSTU[4] * MSTU[4] * (K[3][I - 1] / (MSTU[4] * MSTU[4])) + MSTU[4] * KCM + KCD;
                    KCM = (K[4][I - 1] / MSTU[4]) % MSTU[4];
                    if (KCM > 0 && KCM <= MSTU[3]) KCM = K[2][KCM - 1] / MSTU[4];
                    KCD = K[4][I - 1] % MSTU[4];
                    if (KCD > 0 && KCD <= MSTU[3]) KCD = K[2][KCD - 1] / MSTU[4];
                    K[4][I - 1] = MSTU[4] * MSTU[4] * (K[4][I - 1] / (MSTU[4] * MSTU[4])) + MSTU[4] * KCM + KCD;
                }
            }

            // Pack remaining entries. 
            I1 = 0;
            int MSTU90 = MSTU[89];
            MSTU[89] = 0;
            for (int I = 0; I < N; ++I) {
                if (K[2][I] / MSTU[4] == 0) continue;
                I1++;
                for (int J = 0; J < 5; ++J) {
                    K[J][I1 - 1] = K[J][I];
                    P[J][I1 - 1] = P[J][I];
                    V[J][I1 - 1] = V[J][I];
                }
                K[2][I1 - 1] = K[2][I1 - 1] % MSTU[4]; 
                for (int IZ = 0; IZ < MSTU90; ++IZ) {
                    if (I + 1 == MSTU[90 + IZ]) {
                        MSTU[89]++;
                        MSTU[89 + MSTU[89]] = I1;
                        PARU[89 + MSTU[89]] = PARU[90 + IZ];
                    }
                }
            }
            if (I1 < N) MSTU[2] = 0;
            if (I1 < N) MSTU[69] = 0;
            N = I1;

        // Fill in some missing daughter pointers (lost in colour flow). 
        } else if (MEDIT == 16) {
            for (int I = 1; I < N + 1; ++I) {
                if (K[0][I - 1] <= 10 || K[0][I - 1] > 20) continue;
                if (K[3][I - 1] != 0 || K[4][I - 1] != 0) continue;

                // Find daughters who point to mother.
                for (int I1 = I + 1; I1 < N + 1; ++I1) {
                    if (K[2][I1 - 1] != I) {
                        // do nothing
                    } else if (K[3][I - 1] == 0) {
                        K[3][I - 1] = I1;
                    } else {
                        K[4][I - 1] = I1;
                    }
                }
                if (K[4][I - 1] == 0) K[4][I - 1] = K[3][I - 1];
                if (K[3][I - 1] != 0) continue;

                // Find daughters who point to documentation version of mother.    
                int IM = K[2][I - 1];
                if (IM <= 0 || IM >= I) continue;
                if (K[0][IM - 1] <= 20 || K[0][IM - 1] > 30) continue;
                if (K[1][IM - 1] != K[1][I - 1] || std::abs(P[4][IM - 1] - P[4][I - 1]) > 1e-2) continue;
                for (int I1 = I + 1; I1 < N + 1; ++I1) {
                    if (K[2][I1 - 1] != IM) {
                        // do nothing
                    } else if (K[3][I - 1] == 0) {
                      K[3][I - 1] = I1;
                    } else {
                      K[4][I - 1] = I1;
                    }
                }
                if (K[4][I - 1] == 0) K[4][I - 1] = K[3][I - 1];
                if (K[3][I - 1] != 0) continue;

                // Find daughters who point to documentation daughters who,
                // in their turn, point to documentation mother.
                int ID1 = IM;
                int ID2 = IM;
                for (int I1 = IM + 1; I1 < I; ++I1) {
                    if (K[2][I1 - 1] == IM && K[0][I1 - 1] > 20 && K[0][I1 - 1] <= 30) {
                        ID2 = I1;
                        if (ID1 == IM) ID1 = I1;
                    }
                }
                for (int I1 = I + 1; I1 < N + 1; ++I) {
                    if (K[2][I1 - 1] != ID1 && K[2][I1 - 1] != ID2) {
                    } else if (K[3][I - 1] == 0) {
                        K[3][I - 1] = I1;
                    } else {
                        K[4][I - 1] = I1;
                    }
                }
                if (K[4][I - 1] == 0) K[4][I - 1] = K[3][I - 1];
            }

        // Save top entries at bottom of LUJETS common block.
        } else if (MEDIT == 21) {
            if (2 * N >= MSTU[3]) {
                LUERRM(11, "(LUEDIT:) no more memory left in LUJETS");
                return;
            }
            for (int I = 0; I < N; ++I) {
                for (int J = 0; J < 5; ++J) {
                    K[J][MSTU[3] - I] = K[J][I];
                    P[J][MSTU[3] - I] = P[J][I];
                    V[J][MSTU[3] - I] = V[J][I];
                }
            }
            MSTU[31] = N;

        // Restore bottom entries of common block LUJETS to top.
        } else if (MEDIT == 22) {
            for (int I = 0; I < MSTU[31]; ++I) {
                for (int J = 0; J < 5; ++J) {
                    K[J][I] = K[J][MSTU[3] - I];
                    P[J][I] = P[J][MSTU[3] - I];
                    V[J][I] = V[J][MSTU[3] - I];
                }
            }
            N = MSTU[31];

        // Mark primary entries at top of common block LUJETS as untreated.
        } else if (MEDIT == 23) {
            int I1 = 0;
            for (int I = 0; I < N; ++I) {
                int KH = K[2][I];
                if (KH >= 1) {
                    if (K[0][KH - 1] > 20) KH = 0;
                }
                if (KH != 0) break;
                I1++;
                if (K[0][I] > 10 && K[0][I] <= 20) K[0][I] -= 10;
            }
            N = I1;

        // Place largest axis along z axis and second largest in xy plane.
        } else if (MEDIT == 31 || MEDIT == 32) {
            LUDBRB(1, N + MSTU[2], 0., -ULANGL(P[0][MSTU[60] - 1], P[1][MSTU[60] - 1]), 0., 0., 0.);
            LUDBRB(1, N + MSTU[2], -ULANGL(P[2][MSTU[60] - 1], P[0][MSTU[60] - 1]), 0., 0., 0., 0.);
            LUDBRB(1, N + MSTU[2], 0., -ULANGL(P[0][MSTU[60]], P[0][MSTU[60]]), 0., 0., 0.);
            if (MEDIT == 31) return;
 
            // Rotate to put slim jet along +z axis. 
            for (int IS = 0; IS < 2; ++IS) {
                NS[IS] = 0;
                PTS[IS] = 0.;
                PLS[IS] = 0.;
            }
            for (int I = 0; I < N; ++I) {
                if (K[0][I] <= 0 || K[0][I] > 10) continue;
                if (MSTU[40] >= 2) {
                    int KC = LUCOMP(K[1][I]);
                    if (KC == 0 || KC == 12 || KC == 14 || KC == 16 || KC == 18) continue;
                    if (MSTU[40] >= 3 && KCHG[1][KC - 1] == 0 && LUCHGE(K[1][I]) == 0) continue;
                }
                int IS = (P[2][I] < 0)? 2 : 1;  // this is the most meaningful expression I could derive from: int IS = 2. - SIGN(0.5, P[2][I])
                NS[IS - 1]++;
                PTS[IS - 1] += std::sqrt(P[0][I] * P[0][I] + P[1][I] * P[1][I]);
            }
            if (NS[0] * PTS[1] * PTS[1] < NS[1] * PTS[0] * PTS[0]) LUDBRB(1, N + MSTU[2], PARU[0], 0., 0., 0., 0.);

            // Rotate to put second largest jet into -z,+x quadrant.
            for (int I = 0; I < N; ++I) {
                if (P[2][I] >= 0.) continue;
                if (K[0][I] <= 0 || K[0][I] > 10) continue;
                if (MSTU[40] >= 2) {
                    int KC = LUCOMP(K[1][I]);
                    if (KC == 0 || KC == 12 || KC == 14 || KC == 16 || KC == 18) continue;
                    if (MSTU[40] >= 3 && KCHG[1][KC - 1] == 0 && LUCHGE(K[1][I]) == 0) continue;
                }
                int IS = (P[0][I] < 0)? 2 : 1;  // this is the most meaningful expression I could derive from: int IS = 2. - SIGN(0.5, P[2][I])
                PLS[IS - 1] -= P[2][I];
            }
            if (PLS[1] > PLS[0]) LUDBRB(1, N + MSTU[2], 0., PARU[0], 0., 0., 0.);
      }
      return;
}